

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
 __thiscall
draco::SequentialNormalAttributeDecoder::CreateIntPredictionScheme
          (SequentialNormalAttributeDecoder *this,PredictionSchemeMethod method,
          PredictionSchemeTransformType transform_type)

{
  int iVar1;
  int in_ECX;
  PredictionSchemeMethod in_EDX;
  SequentialAttributeDecoder *in_RSI;
  _Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false> in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false> _Var2;
  PointCloudDecoder *in_stack_ffffffffffffffe0;
  PredictionSchemeMethod method_00;
  
  _Var2._M_head_impl = in_RDI._M_head_impl;
  if (in_ECX == 2) {
    method_00 = in_EDX;
    iVar1 = SequentialAttributeDecoder::attribute_id(in_RSI);
    SequentialAttributeDecoder::decoder(in_RSI);
    CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>
              (method_00,in_ECX,in_stack_ffffffffffffffe0);
    std::
    unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,int>,std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,int>>>
    ::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                *)_Var2._M_head_impl,
               (unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                *)in_RDI._M_head_impl);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
    ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                   *)CONCAT44(iVar1,in_EDX));
  }
  else if (in_ECX == 3) {
    SequentialAttributeDecoder::attribute_id(in_RSI);
    SequentialAttributeDecoder::decoder(in_RSI);
    CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>
              (in_EDX,in_ECX,in_stack_ffffffffffffffe0);
    std::
    unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,int>,std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,int>>>
    ::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                *)_Var2._M_head_impl,
               (unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                *)in_RDI._M_head_impl);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
    ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    std::
    unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,int>,std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,int>>>
    ::unique_ptr<std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,int>>,void>
              ((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (nullptr_t)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    _Var2._M_head_impl = in_RDI._M_head_impl;
  }
  return (__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
          )(tuple<draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
            )_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeTypedDecoderInterface<int32_t>>
  CreateIntPredictionScheme(
      PredictionSchemeMethod method,
      PredictionSchemeTransformType transform_type) override {
    switch (transform_type) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      case PREDICTION_TRANSFORM_NORMAL_OCTAHEDRON: {
        typedef PredictionSchemeNormalOctahedronDecodingTransform<int32_t>
            Transform;
        // At this point the decoder has not read the quantization bits,
        // which is why we must construct the transform by default.
        // See Transform.DecodeTransformData for more details.
        return CreatePredictionSchemeForDecoder<int32_t, Transform>(
            method, attribute_id(), decoder());
      }
#endif
      case PREDICTION_TRANSFORM_NORMAL_OCTAHEDRON_CANONICALIZED: {
        typedef PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<
            int32_t>
            Transform;
        // At this point the decoder has not read the quantization bits,
        // which is why we must construct the transform by default.
        // See Transform.DecodeTransformData for more details.
        return CreatePredictionSchemeForDecoder<int32_t, Transform>(
            method, attribute_id(), decoder());
      }
      default:
        return nullptr;  // Currently, we support only octahedron transform and
                         // octahedron transform canonicalized.
    }
  }